

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O3

Gia_Man_t * Gia_ManDupCollapse(Gia_Man_t *p,Gia_Man_t *pBoxes,Vec_Int_t *vBoxPres,int fSeq)

{
  Tim_Man_t *p_00;
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Man_t *pGVar6;
  size_t sVar7;
  char *pcVar8;
  int *piVar9;
  Gia_Obj_t *pGVar10;
  long lVar11;
  Gia_Obj_t *pGVar12;
  Gia_Obj_t *pGVar13;
  Gia_Man_t *pGVar14;
  ulong uVar15;
  char *pcVar16;
  char cVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  int local_88;
  int local_84;
  uint local_80;
  int local_78;
  int local_74;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  if ((fSeq != 0) && (p->vRegClasses == (Vec_Int_t *)0x0)) {
    __assert_fail("!fSeq || p->vRegClasses",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x329,"Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)"
                 );
  }
  iVar3 = p->vCis->nSize;
  iVar2 = Tim_ManPiNum(p_00);
  if (iVar3 != iVar2 + pBoxes->vCos->nSize) {
    __assert_fail("Gia_ManCiNum(p) == Tim_ManPiNum(pManTime) + Gia_ManCoNum(pBoxes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x32b,"Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)"
                 );
  }
  pGVar6 = Gia_ManStart(p->nObjs);
  pcVar16 = p->pName;
  if (pcVar16 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar16);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar16);
  }
  pGVar6->pName = pcVar8;
  pcVar16 = p->pSpec;
  if (pcVar16 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar16);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar16);
  }
  pGVar6->pSpec = pcVar8;
  if (p->pSibls != (int *)0x0) {
    piVar9 = (int *)calloc((long)p->nObjs,4);
    pGVar6->pSibls = piVar9;
  }
  Gia_ManHashAlloc(pGVar6);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  Gia_ManIncrementTravId(p);
  if (p->nObjs < 1) {
LAB_002363ad:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->nTravIdsAlloc < 1) {
LAB_002363cc:
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  *p->pTravIds = p->nTravIds;
  iVar3 = Tim_ManPiNum(p_00);
  if (0 < iVar3) {
    lVar18 = 0;
    do {
      if (p->vCis->nSize <= lVar18) goto LAB_0023638e;
      iVar3 = p->vCis->pArray[lVar18];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_0023636f;
      pGVar12 = p->pObjs + iVar3;
      pGVar10 = Gia_ManAppendObj(pGVar6);
      uVar20 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar20 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar20 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(pGVar6->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar13 = pGVar6->pObjs;
      if ((pGVar10 < pGVar13) || (pGVar13 + pGVar6->nObjs <= pGVar10)) goto LAB_002363ad;
      Vec_IntPush(pGVar6->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar13) >> 2) * -0x55555555);
      pGVar13 = pGVar6->pObjs;
      if ((pGVar10 < pGVar13) || (pGVar13 + pGVar6->nObjs <= pGVar10)) goto LAB_002363ad;
      pGVar12->Value = (int)((ulong)((long)pGVar10 - (long)pGVar13) >> 2) * 0x55555556;
      pGVar13 = p->pObjs;
      if ((pGVar12 < pGVar13) || (pGVar13 + p->nObjs <= pGVar12)) goto LAB_002363ad;
      iVar3 = (int)((long)pGVar12 - (long)pGVar13 >> 2) * -0x55555555;
      if (p->nTravIdsAlloc <= iVar3) goto LAB_002363cc;
      p->pTravIds[iVar3] = p->nTravIds;
      lVar18 = lVar18 + 1;
      iVar3 = Tim_ManPiNum(p_00);
    } while (lVar18 < iVar3);
  }
  local_80 = Tim_ManPiNum(p_00);
  iVar3 = Tim_ManBoxNum(p_00);
  if (iVar3 < 1) {
    local_84 = 0;
    local_78 = 0;
    local_74 = 0;
    local_88 = 0;
  }
  else {
    lVar18 = 0;
    local_88 = 0;
    local_74 = 0;
    local_78 = 0;
    local_84 = 0;
    do {
      Gia_ManIncrementTravId(pBoxes);
      if (pBoxes->nObjs < 1) goto LAB_002363ad;
      if (pBoxes->nTravIdsAlloc < 1) goto LAB_002363cc;
      pGVar13 = pBoxes->pObjs;
      *pBoxes->pTravIds = pBoxes->nTravIds;
      pGVar13->Value = 0;
      iVar2 = (int)lVar18;
      iVar3 = Tim_ManBoxIsBlack(p_00,iVar2);
      if (iVar3 == 0) {
        iVar3 = Tim_ManBoxInputNum(p_00,iVar2);
        if (0 < iVar3) {
          lVar19 = (long)local_84;
          lVar21 = 0;
          do {
            if ((local_84 < 0) || (p->vCos->nSize <= lVar19)) goto LAB_0023638e;
            iVar3 = p->vCos->pArray[lVar19];
            if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_0023636f;
            pGVar13 = p->pObjs + iVar3;
            Gia_ManDupCollapse_rec
                      (p,pGVar13 + -(ulong)((uint)*(undefined8 *)pGVar13 & 0x1fffffff),pGVar6);
            if (pBoxes->vCis->nSize <= lVar21) goto LAB_0023638e;
            iVar3 = pBoxes->vCis->pArray[lVar21];
            lVar11 = (long)iVar3;
            if ((lVar11 < 0) || (pBoxes->nObjs <= iVar3)) goto LAB_0023636f;
            if ((int)pGVar13[-(ulong)((uint)*(undefined8 *)pGVar13 & 0x1fffffff)].Value < 0)
            goto LAB_002363eb;
            pBoxes->pObjs[lVar11].Value =
                 (uint)*(undefined8 *)pGVar13 >> 0x1d & 1 ^
                 pGVar13[-(ulong)((uint)*(undefined8 *)pGVar13 & 0x1fffffff)].Value;
            if (pBoxes->nTravIdsAlloc <= iVar3) goto LAB_002363cc;
            pBoxes->pTravIds[lVar11] = pBoxes->nTravIds;
            lVar21 = lVar21 + 1;
            iVar3 = Tim_ManBoxInputNum(p_00,iVar2);
            lVar19 = lVar19 + 1;
          } while (lVar21 < iVar3);
        }
        iVar3 = Tim_ManBoxOutputNum(p_00,iVar2);
        if (0 < iVar3) {
          lVar21 = (long)(int)local_80;
          lVar19 = 0;
          do {
            iVar3 = Tim_ManPiNum(p_00);
            uVar20 = (ulong)(uint)-iVar3 + (ulong)local_80 + lVar19;
            iVar3 = (int)uVar20;
            if ((iVar3 < 0) || (pBoxes->vCos->nSize <= iVar3)) goto LAB_0023638e;
            iVar3 = pBoxes->vCos->pArray[uVar20 & 0xffffffff];
            if (((long)iVar3 < 0) || (pBoxes->nObjs <= iVar3)) goto LAB_0023636f;
            pGVar13 = pBoxes->pObjs + iVar3;
            Gia_ManDupCollapse_rec
                      (pBoxes,pGVar13 + -(ulong)((uint)*(undefined8 *)pGVar13 & 0x1fffffff),pGVar6);
            if ((lVar21 < 0) || (p->vCis->nSize <= lVar21)) goto LAB_0023638e;
            iVar3 = p->vCis->pArray[lVar21];
            lVar11 = (long)iVar3;
            if ((lVar11 < 0) || (p->nObjs <= iVar3)) goto LAB_0023636f;
            if ((int)pGVar13[-(ulong)((uint)*(undefined8 *)pGVar13 & 0x1fffffff)].Value < 0)
            goto LAB_002363eb;
            p->pObjs[lVar11].Value =
                 (uint)*(undefined8 *)pGVar13 >> 0x1d & 1 ^
                 pGVar13[-(ulong)((uint)*(undefined8 *)pGVar13 & 0x1fffffff)].Value;
            if (p->nTravIdsAlloc <= iVar3) goto LAB_002363cc;
            p->pTravIds[lVar11] = p->nTravIds;
            lVar19 = lVar19 + 1;
            iVar3 = Tim_ManBoxOutputNum(p_00,iVar2);
            lVar21 = lVar21 + 1;
          } while (lVar19 < iVar3);
        }
      }
      else {
        if (vBoxPres == (Vec_Int_t *)0x0) {
          bVar22 = false;
        }
        else {
          if (vBoxPres->nSize <= lVar18) goto LAB_0023638e;
          bVar22 = vBoxPres->pArray[lVar18] == 0;
        }
        iVar3 = Tim_ManBoxInputNum(p_00,iVar2);
        if (0 < iVar3) {
          lVar21 = (long)local_84;
          lVar19 = 0;
          do {
            if ((local_84 < 0) || (p->vCos->nSize <= lVar21)) goto LAB_0023638e;
            iVar3 = p->vCos->pArray[lVar21];
            if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_0023636f;
            pGVar13 = p->pObjs + iVar3;
            Gia_ManDupCollapse_rec
                      (p,pGVar13 + -(ulong)((uint)*(undefined8 *)pGVar13 & 0x1fffffff),pGVar6);
            uVar4 = 0xffffffff;
            if (bVar22 == false) {
              if ((int)pGVar13[-(ulong)((uint)*(undefined8 *)pGVar13 & 0x1fffffff)].Value < 0)
              goto LAB_002363eb;
              uVar4 = Gia_ManAppendCo(pGVar6,(uint)*(undefined8 *)pGVar13 >> 0x1d & 1 ^
                                             pGVar13[-(ulong)((uint)*(undefined8 *)pGVar13 &
                                                             0x1fffffff)].Value);
            }
            pGVar13->Value = uVar4;
            lVar19 = lVar19 + 1;
            iVar3 = Tim_ManBoxInputNum(p_00,iVar2);
            lVar21 = lVar21 + 1;
          } while (lVar19 < iVar3);
          local_74 = local_74 + (int)lVar19;
        }
        iVar3 = Tim_ManBoxOutputNum(p_00,iVar2);
        if (0 < iVar3) {
          lVar21 = (long)(int)local_80;
          lVar19 = 0;
          do {
            if (((int)local_80 < 0) || (p->vCis->nSize <= lVar21)) goto LAB_0023638e;
            iVar3 = p->vCis->pArray[lVar21];
            if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_0023636f;
            pGVar13 = p->pObjs;
            uVar4 = 0;
            pGVar10 = pGVar13;
            if (bVar22 == false) {
              pGVar12 = Gia_ManAppendObj(pGVar6);
              uVar20 = *(ulong *)pGVar12;
              *(ulong *)pGVar12 = uVar20 | 0x9fffffff;
              *(ulong *)pGVar12 =
                   uVar20 & 0xe0000000ffffffff | 0x9fffffff |
                   (ulong)(pGVar6->vCis->nSize & 0x1fffffff) << 0x20;
              pGVar10 = pGVar6->pObjs;
              if ((pGVar12 < pGVar10) || (pGVar10 + pGVar6->nObjs <= pGVar12)) goto LAB_002363ad;
              Vec_IntPush(pGVar6->vCis,
                          (int)((ulong)((long)pGVar12 - (long)pGVar10) >> 2) * -0x55555555);
              pGVar10 = pGVar6->pObjs;
              if ((pGVar12 < pGVar10) || (pGVar10 + pGVar6->nObjs <= pGVar12)) goto LAB_002363ad;
              uVar4 = (int)((ulong)((long)pGVar12 - (long)pGVar10) >> 2) * 0x55555556;
              pGVar10 = p->pObjs;
            }
            pGVar13 = pGVar13 + iVar3;
            pGVar13->Value = uVar4;
            if ((pGVar13 < pGVar10) || (pGVar10 + p->nObjs <= pGVar13)) goto LAB_002363ad;
            iVar3 = (int)((long)pGVar13 - (long)pGVar10 >> 2) * -0x55555555;
            if (p->nTravIdsAlloc <= iVar3) goto LAB_002363cc;
            p->pTravIds[iVar3] = p->nTravIds;
            local_88 = local_88 + (uint)(bVar22 ^ 1);
            lVar19 = lVar19 + 1;
            iVar3 = Tim_ManBoxOutputNum(p_00,iVar2);
            lVar21 = lVar21 + 1;
          } while (lVar19 < iVar3);
          local_78 = local_78 + (int)lVar19;
        }
      }
      iVar3 = Tim_ManBoxInputNum(p_00,iVar2);
      local_84 = local_84 + iVar3;
      iVar3 = Tim_ManBoxOutputNum(p_00,iVar2);
      local_80 = local_80 + iVar3;
      lVar18 = lVar18 + 1;
      iVar3 = Tim_ManBoxNum(p_00);
    } while (lVar18 < iVar3);
  }
  iVar3 = Tim_ManCoNum(p_00);
  iVar2 = Tim_ManPoNum(p_00);
  uVar4 = iVar3 - iVar2;
  iVar3 = Tim_ManCoNum(p_00);
  if ((int)uVar4 < iVar3) {
    uVar20 = (ulong)uVar4;
    do {
      if (((int)uVar4 < 0) || (p->vCos->nSize <= (int)uVar20)) goto LAB_0023638e;
      iVar3 = p->vCos->pArray[uVar20];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_0023636f;
      pGVar13 = p->pObjs + iVar3;
      Gia_ManDupCollapse_rec(p,pGVar13 + -(*(ulong *)pGVar13 & 0x1fffffff),pGVar6);
      if ((int)pGVar13[-(*(ulong *)pGVar13 & 0x1fffffff)].Value < 0) {
LAB_002363eb:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar5 = Gia_ManAppendCo(pGVar6,(uint)(*(ulong *)pGVar13 >> 0x1d) & 1 ^
                                     pGVar13[-(*(ulong *)pGVar13 & 0x1fffffff)].Value);
      pGVar13->Value = uVar5;
      uVar20 = uVar20 + 1;
      iVar3 = Tim_ManCoNum(p_00);
    } while ((int)uVar20 < iVar3);
  }
  iVar3 = Tim_ManPoNum(p_00);
  if (local_80 != p->vCis->nSize) {
    __assert_fail("curCi == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x37f,"Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)"
                 );
  }
  if (iVar3 + local_84 != p->vCos->nSize) {
    __assert_fail("curCo == Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x380,"Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)"
                 );
  }
  if ((fSeq == 0) || (p->vRegClasses == (Vec_Int_t *)0x0)) {
    piVar9 = &p->nRegs;
  }
  else {
    piVar9 = &p->vRegClasses->nSize;
  }
  Gia_ManSetRegNum(pGVar6,*piVar9);
  Gia_ManHashStop(pGVar6);
  pGVar14 = Gia_ManCleanup(pGVar6);
  Gia_ManCleanupRemap(p,pGVar6);
  Gia_ManStop(pGVar6);
  pGVar6 = pGVar14;
  if (local_88 != 0) {
    iVar3 = Tim_ManPiNum(p_00);
    pGVar6 = Gia_ManDupMoveLast(pGVar14,iVar3 - pGVar14->nRegs,local_88);
    Gia_ManCleanupRemap(p,pGVar14);
    Gia_ManStop(pGVar14);
  }
  if (vBoxPres == (Vec_Int_t *)0x0) {
    iVar3 = Tim_ManPoNum(p_00);
    if (iVar3 != pGVar6->vCos->nSize - local_74) {
      __assert_fail("vBoxPres != NULL || Tim_ManPoNum(pManTime) == Gia_ManCoNum(pNew) - nBBouts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                    ,0x395,
                    "Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)");
    }
    iVar3 = Tim_ManPiNum(p_00);
    if (iVar3 != pGVar6->vCis->nSize - local_78) {
      __assert_fail("vBoxPres != NULL || Tim_ManPiNum(pManTime) == Gia_ManCiNum(pNew) - nBBins",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                    ,0x396,
                    "Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)");
    }
  }
  pGVar14 = pGVar6;
  if ((fSeq != 0) && (pVVar1 = p->vRegInits, pVVar1 != (Vec_Int_t *)0x0)) {
    uVar4 = pVVar1->nSize;
    uVar20 = (ulong)uVar4;
    if (0 < (int)uVar4) {
      piVar9 = pVVar1->pArray;
      uVar15 = 0;
      iVar3 = 0;
      do {
        iVar3 = iVar3 + piVar9[uVar15];
        uVar15 = uVar15 + 1;
      } while (uVar20 != uVar15);
      if (iVar3 != 0) {
        pcVar16 = (char *)malloc(uVar20 + 1);
        if (uVar4 != pGVar6->nRegs) {
          __assert_fail("Vec_IntSize(p->vRegInits) == Gia_ManRegNum(pNew)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                        ,0x39d,
                        "Gia_Man_t *Gia_ManDupCollapse(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)")
          ;
        }
        pVVar1 = pGVar6->vCis;
        iVar3 = pVVar1->nSize;
        uVar4 = iVar3 - uVar4;
        uVar15 = 0;
        do {
          iVar2 = uVar4 + (int)uVar15;
          if ((iVar2 < 0) || (iVar3 <= iVar2)) {
LAB_0023638e:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar2 = pVVar1->pArray[uVar4 + uVar15];
          if ((iVar2 < 0) || (pGVar6->nObjs <= iVar2)) {
LAB_0023636f:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (pGVar6->pObjs == (Gia_Obj_t *)0x0) break;
          if (uVar20 <= uVar15) goto LAB_0023638e;
          iVar2 = piVar9[uVar15];
          cVar17 = 'X';
          if (iVar2 == 1) {
            cVar17 = '1';
          }
          if (iVar2 == 0) {
            cVar17 = '0';
          }
          pcVar16[uVar15] = cVar17;
          uVar15 = uVar15 + 1;
        } while (uVar15 < uVar20);
        pcVar16[uVar15] = '\0';
        pGVar14 = Gia_ManDupZeroUndc(pGVar6,pcVar16,0,0,1);
        pGVar14->nConstrs = pGVar6->nConstrs;
        pGVar6->nConstrs = 0;
        Gia_ManStop(pGVar6);
        free(pcVar16);
      }
    }
  }
  return pGVar14;
}

Assistant:

Gia_Man_t * Gia_ManDupCollapse( Gia_Man_t * p, Gia_Man_t * pBoxes, Vec_Int_t * vBoxPres, int fSeq )
{
    // this procedure assumes that sequential AIG with boxes is unshuffled to have valid boxes
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjBox;
    int i, k, curCi, curCo, nBBins = 0, nBBouts = 0, nNewPis = 0;
    assert( !fSeq || p->vRegClasses );
    //assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManCiNum(p) == Tim_ManPiNum(pManTime) + Gia_ManCoNum(pBoxes) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    if ( Gia_ManHasChoices(p) )
        pNew->pSibls = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManHashAlloc( pNew );
    // copy const and real PIs
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < Tim_ManPiNum(pManTime); i++ )
    {
        pObj = Gia_ManCi( p, i );
        pObj->Value = Gia_ManAppendCi(pNew);
        Gia_ObjSetTravIdCurrent( p, pObj );
    }
    // create logic for each box
    curCi = Tim_ManPiNum(pManTime);
    curCo = 0;
    for ( i = 0; i < Tim_ManBoxNum(pManTime); i++ )
    {
        // clean boxes
        Gia_ManIncrementTravId( pBoxes );
        Gia_ObjSetTravIdCurrent( pBoxes, Gia_ManConst0(pBoxes) );
        Gia_ManConst0(pBoxes)->Value = 0;
        // add internal nodes
        //printf( "%d ", Tim_ManBoxIsBlack(pManTime, i) );
        if ( Tim_ManBoxIsBlack(pManTime, i) )
        {
            int fSkip = (vBoxPres != NULL && !Vec_IntEntry(vBoxPres, i));
            for ( k = 0; k < Tim_ManBoxInputNum(pManTime, i); k++ )
            {
                pObj = Gia_ManCo( p, curCo + k );
                Gia_ManDupCollapse_rec( p, Gia_ObjFanin0(pObj), pNew );
                pObj->Value = fSkip ? -1 : Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
                nBBouts++;
            }
            for ( k = 0; k < Tim_ManBoxOutputNum(pManTime, i); k++ )
            {
                pObj = Gia_ManCi( p, curCi + k );
                pObj->Value = fSkip ? 0 : Gia_ManAppendCi(pNew);
                Gia_ObjSetTravIdCurrent( p, pObj );
                nBBins++;
                nNewPis += !fSkip;
            }
        }
        else
        {
            for ( k = 0; k < Tim_ManBoxInputNum(pManTime, i); k++ )
            {
                // build logic
                pObj = Gia_ManCo( p, curCo + k );
                Gia_ManDupCollapse_rec( p, Gia_ObjFanin0(pObj), pNew );
                // transfer to the PI
                pObjBox = Gia_ManCi( pBoxes, k );
                pObjBox->Value = Gia_ObjFanin0Copy(pObj);
                Gia_ObjSetTravIdCurrent( pBoxes, pObjBox );
            }
            for ( k = 0; k < Tim_ManBoxOutputNum(pManTime, i); k++ )
            {
                // build logic
                pObjBox = Gia_ManCo( pBoxes, curCi - Tim_ManPiNum(pManTime) + k );
                Gia_ManDupCollapse_rec( pBoxes, Gia_ObjFanin0(pObjBox), pNew );
                // transfer to the PI
                pObj = Gia_ManCi( p, curCi + k );
                pObj->Value = Gia_ObjFanin0Copy(pObjBox);
                Gia_ObjSetTravIdCurrent( p, pObj );
            }
        }
        curCo += Tim_ManBoxInputNum(pManTime, i);
        curCi += Tim_ManBoxOutputNum(pManTime, i);
    }
    //printf( "\n" );
    // add remaining nodes
    for ( i = Tim_ManCoNum(pManTime) - Tim_ManPoNum(pManTime); i < Tim_ManCoNum(pManTime); i++ )
    {
        pObj = Gia_ManCo( p, i );
        Gia_ManDupCollapse_rec( p, Gia_ObjFanin0(pObj), pNew );
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    curCo += Tim_ManPoNum(pManTime);
    // verify counts
    assert( curCi == Gia_ManCiNum(p) );
    assert( curCo == Gia_ManCoNum(p) );
    Gia_ManSetRegNum( pNew, (fSeq && p->vRegClasses) ? Vec_IntSize(p->vRegClasses) : Gia_ManRegNum(p) );
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManCleanupRemap( p, pTemp );
    Gia_ManStop( pTemp );
    if ( nNewPis )
    {
        pNew = Gia_ManDupMoveLast( pTemp = pNew, Tim_ManPiNum(pManTime)-Gia_ManRegNum(pNew), nNewPis );
        Gia_ManCleanupRemap( p, pTemp );
        Gia_ManStop( pTemp );
    }
/*
    printf( "%d = %d - %d    Diff = %d\n", 
        Tim_ManPoNum(pManTime),   Gia_ManCoNum(pNew),  nBBouts, 
        Tim_ManPoNum(pManTime) - (Gia_ManCoNum(pNew) - nBBouts) );

    printf( "%d = %d - %d    Diff = %d\n\n", 
        Tim_ManPiNum(pManTime),   Gia_ManCiNum(pNew),  nBBins, 
        Tim_ManPiNum(pManTime) - (Gia_ManCiNum(pNew) - nBBins) );
*/
    assert( vBoxPres != NULL || Tim_ManPoNum(pManTime) == Gia_ManCoNum(pNew) - nBBouts );
    assert( vBoxPres != NULL || Tim_ManPiNum(pManTime) == Gia_ManCiNum(pNew) - nBBins );
    // implement initial state if given
    if ( fSeq && p->vRegInits && Vec_IntSum(p->vRegInits) )
    {
        char * pInit = ABC_ALLOC( char, Vec_IntSize(p->vRegInits) + 1 );
        Gia_Obj_t * pObj;
        int i;
        assert( Vec_IntSize(p->vRegInits) == Gia_ManRegNum(pNew) );
        Gia_ManForEachRo( pNew, pObj, i )
        {
            if ( Vec_IntEntry(p->vRegInits, i) == 0 )
                pInit[i] = '0';
            else if ( Vec_IntEntry(p->vRegInits, i) == 1 )
                pInit[i] = '1';
            else 
                pInit[i] = 'X';
        }
        pInit[i] = 0;
        pNew = Gia_ManDupZeroUndc( pTemp = pNew, pInit, 0, 0, 1 );
        pNew->nConstrs = pTemp->nConstrs; pTemp->nConstrs = 0;
        Gia_ManStop( pTemp );
        ABC_FREE( pInit );
    }
    return pNew;
}